

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

optional<IndexType> index_type_from_string(string *type)

{
  bool bVar1;
  IndexType *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  _Optional_payload_base<IndexType> local_8;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (char *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::optional<IndexType>::optional<IndexType,_true>
              ((optional<IndexType> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            (char *)in_stack_ffffffffffffffd8);
    if (bVar1) {
      std::optional<IndexType>::optional<IndexType,_true>
                ((optional<IndexType> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              (char *)in_stack_ffffffffffffffd8);
      if (bVar1) {
        std::optional<IndexType>::optional<IndexType,_true>
                  ((optional<IndexType> *)CONCAT44(3,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                (char *)in_stack_ffffffffffffffd8);
        if (bVar1) {
          std::optional<IndexType>::optional<IndexType,_true>
                    ((optional<IndexType> *)CONCAT44(in_stack_ffffffffffffffe4,4),
                     in_stack_ffffffffffffffd8);
        }
        else {
          std::optional<IndexType>::optional((optional<IndexType> *)&local_8);
        }
      }
    }
  }
  return (optional<IndexType>)local_8;
}

Assistant:

std::optional<IndexType> index_type_from_string(const std::string &type) {
    if (type == "gram3") {
        return IndexType::GRAM3;
    }
    if (type == "text4") {
        return IndexType::TEXT4;
    }
    if (type == "hash4") {
        return IndexType::HASH4;
    }
    if (type == "wide8") {
        return IndexType::WIDE8;
    }
    return std::nullopt;
}